

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index)

{
  long in_RDI;
  VmaBlockVector *in_stack_00000080;
  VmaDefragmentationContext_T *in_stack_00000088;
  size_t in_stack_000000a8;
  undefined7 in_stack_000000b0;
  bool in_stack_000000b7;
  VmaDefragmentationContext_T *in_stack_000000b8;
  VmaBlockVector *in_stack_000000c0;
  VmaDefragmentationContext_T *in_stack_000000c8;
  bool local_1;
  
  switch(*(undefined4 *)(in_RDI + 0x3c)) {
  case 1:
    local_1 = ComputeDefragmentation_Fast(this,vector);
    break;
  default:
  case 2:
    local_1 = ComputeDefragmentation_Balanced
                        (in_stack_000000c8,in_stack_000000c0,(size_t)in_stack_000000b8,
                         in_stack_000000b7);
    break;
  case 4:
    local_1 = ComputeDefragmentation_Full(in_stack_00000088,in_stack_00000080);
    break;
  case 8:
    local_1 = ComputeDefragmentation_Extensive
                        (in_stack_000000b8,
                         (VmaBlockVector *)CONCAT17(in_stack_000000b7,in_stack_000000b0),
                         in_stack_000000a8);
  }
  return local_1;
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation(VmaBlockVector& vector, size_t index)
{
    switch (m_Algorithm)
    {
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_FAST_BIT:
        return ComputeDefragmentation_Fast(vector);
    default:
        VMA_ASSERT(0);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_BALANCED_BIT:
        return ComputeDefragmentation_Balanced(vector, index, true);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_FULL_BIT:
        return ComputeDefragmentation_Full(vector);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_EXTENSIVE_BIT:
        return ComputeDefragmentation_Extensive(vector, index);
    }
}